

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  IMutableRegistryHub *pIVar1;
  allocator local_1cb;
  allocator local_1ca;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  TestCase local_148;
  
  pIVar1 = getMutableRegistryHub();
  std::__cxx11::string::string((string *)&local_168,classOrQualifiedMethodName,&local_1c9);
  extractClassName(&local_188,&local_168);
  std::__cxx11::string::string((string *)&local_1a8,nameAndDesc->name,&local_1ca);
  std::__cxx11::string::string((string *)&local_1c8,nameAndDesc->description,&local_1cb);
  makeTestCase(&local_148,testCase,&local_188,&local_1a8,&local_1c8,lineInfo);
  (*pIVar1->_vptr_IMutableRegistryHub[3])(pIVar1,&local_148);
  TestCase::~TestCase(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    char const* classOrQualifiedMethodName,
                                    NameAndDesc const& nameAndDesc,
                                    SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase( testCase,
                            extractClassName( classOrQualifiedMethodName ),
                            nameAndDesc.name,
                            nameAndDesc.description,
                            lineInfo ) );
    }